

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O2

void ImGui::BeginDockableDragDropSource(ImGuiWindow *window)

{
  float fVar1;
  ImGuiContext *pIVar2;
  ImGuiWindow *pIVar3;
  bool bVar4;
  ImU32 IVar5;
  ImGuiContext *g;
  long lVar6;
  ImGuiWindow *local_38;
  ImRect local_30;
  
  pIVar2 = GImGui;
  if (GImGui->ActiveId != window->MoveId) {
    __assert_fail("g.ActiveId == window->MoveId",
                  "/workspace/llm4binary/github/license_c_cmakelists/binji[P]binjgb/third_party/imgui/imgui.cpp"
                  ,0x3eca,"void ImGui::BeginDockableDragDropSource(ImGuiWindow *)");
  }
  if (GImGui->MovingWindow != window) {
    __assert_fail("g.MovingWindow == window",
                  "/workspace/llm4binary/github/license_c_cmakelists/binji[P]binjgb/third_party/imgui/imgui.cpp"
                  ,0x3ecb,"void ImGui::BeginDockableDragDropSource(ImGuiWindow *)");
  }
  if (GImGui->CurrentWindow != window) {
    __assert_fail("g.CurrentWindow == window",
                  "/workspace/llm4binary/github/license_c_cmakelists/binji[P]binjgb/third_party/imgui/imgui.cpp"
                  ,0x3ecc,"void ImGui::BeginDockableDragDropSource(ImGuiWindow *)");
  }
  (GImGui->LastItemData).ID = GImGui->ActiveId;
  local_38 = window->RootWindowDockTree;
  if ((local_38->Flags & 0x200000) == 0) {
    if ((pIVar2->IO).ConfigDockingWithShift == false) {
      local_30.Max.x = (local_38->SizeFull).x;
      fVar1 = (pIVar2->Style).FramePadding.y;
      local_30.Max.y = fVar1 + fVar1 + pIVar2->FontSize;
      local_30.Min.x = 0.0;
      local_30.Min.y = 0.0;
      bVar4 = ImRect::Contains(&local_30,&pIVar2->ActiveIdClickOffset);
      if (!bVar4) {
        return;
      }
    }
    bVar4 = BeginDragDropSource(0x25);
    if (bVar4) {
      SetDragDropPayload("_IMWINDOW",&local_38,8,0);
      EndDragDropSource();
      pIVar3 = local_38;
      for (lVar6 = 0; lVar6 != 0x18; lVar6 = lVar6 + 4) {
        IVar5 = ColorConvertFloat4ToU32
                          ((pIVar2->Style).Colors + *(int *)((long)GWindowDockStyleColors + lVar6));
        *(ImU32 *)((long)(pIVar3->DockStyle).Colors + lVar6) = IVar5;
      }
    }
    return;
  }
  __assert_fail("(window->Flags & ImGuiWindowFlags_NoDocking) == 0",
                "/workspace/llm4binary/github/license_c_cmakelists/binji[P]binjgb/third_party/imgui/imgui.cpp"
                ,0x3ed0,"void ImGui::BeginDockableDragDropSource(ImGuiWindow *)");
}

Assistant:

void ImGui::BeginDockableDragDropSource(ImGuiWindow* window)
{
    ImGuiContext& g = *GImGui;
    IM_ASSERT(g.ActiveId == window->MoveId);
    IM_ASSERT(g.MovingWindow == window);
    IM_ASSERT(g.CurrentWindow == window);

    g.LastItemData.ID = window->MoveId;
    window = window->RootWindowDockTree;
    IM_ASSERT((window->Flags & ImGuiWindowFlags_NoDocking) == 0);
    bool is_drag_docking = (g.IO.ConfigDockingWithShift) || ImRect(0, 0, window->SizeFull.x, GetFrameHeight()).Contains(g.ActiveIdClickOffset); // FIXME-DOCKING: Need to make this stateful and explicit
    if (is_drag_docking && BeginDragDropSource(ImGuiDragDropFlags_SourceNoPreviewTooltip | ImGuiDragDropFlags_SourceNoHoldToOpenOthers | ImGuiDragDropFlags_SourceAutoExpirePayload))
    {
        SetDragDropPayload(IMGUI_PAYLOAD_TYPE_WINDOW, &window, sizeof(window));
        EndDragDropSource();

        // Store style overrides
        for (int color_n = 0; color_n < ImGuiWindowDockStyleCol_COUNT; color_n++)
            window->DockStyle.Colors[color_n] = ColorConvertFloat4ToU32(g.Style.Colors[GWindowDockStyleColors[color_n]]);
    }
}